

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void estimate_noise(FIRSTPASS_STATS *first_stats,FIRSTPASS_STATS *last_stats,
                   aom_internal_error_info *error_info)

{
  FIRSTPASS_STATS *pFVar1;
  bool bVar2;
  FIRSTPASS_STATS *pFVar3;
  int iVar4;
  aom_internal_error_info *in_RDX;
  FIRSTPASS_STATS *in_RSI;
  ulong in_RDI;
  double dVar5;
  double dVar6;
  int found_1;
  int found;
  double noise;
  double C3;
  double C2;
  double C1;
  FIRSTPASS_STATS *next_stats;
  FIRSTPASS_STATS *this_stats;
  double local_58;
  FIRSTPASS_STATS *in_stack_ffffffffffffffd0;
  FIRSTPASS_STATS *in_stack_ffffffffffffffd8;
  FIRSTPASS_STATS *local_20;
  
  for (local_20 = (FIRSTPASS_STATS *)(in_RDI + 0x1d0); local_20 < in_RSI; local_20 = local_20 + 1) {
    local_20->noise_var = 0.0;
    if (((local_20->is_flash == 0) && (local_20[-1].is_flash == 0)) && (local_20[-2].is_flash == 0))
    {
      in_stack_ffffffffffffffd0 =
           (FIRSTPASS_STATS *)
           (local_20[-1].intra_error * (local_20->intra_error - local_20->coded_error));
      dVar5 = local_20[-2].intra_error * (local_20[-1].intra_error - local_20[-1].coded_error);
      dVar6 = local_20[-2].intra_error * (local_20->intra_error - local_20->sr_coded_error);
      if (((0.0 < (double)in_stack_ffffffffffffffd0) && (0.0 < dVar5)) && (0.0 < dVar6)) {
        in_stack_ffffffffffffffd0 = (FIRSTPASS_STATS *)sqrt((double)in_stack_ffffffffffffffd0);
        dVar5 = sqrt(dVar5);
        dVar6 = sqrt(dVar6);
        local_58 = local_20[-1].intra_error - ((double)in_stack_ffffffffffffffd0 * dVar5) / dVar6;
        if (local_58 <= 0.01) {
          local_58 = 0.01;
        }
        local_20->noise_var = local_58;
      }
    }
  }
  for (local_20 = (FIRSTPASS_STATS *)(in_RDI + 0x1d0); local_20 < in_RSI; local_20 = local_20 + 1) {
    if (((local_20->is_flash == 0) && (local_20[-1].is_flash == 0)) &&
       ((local_20[-2].is_flash == 0 && (local_20->noise_var <= 1.0 && local_20->noise_var != 1.0))))
    {
      bVar2 = false;
      pFVar3 = local_20;
      do {
        pFVar1 = pFVar3;
        in_stack_ffffffffffffffd8 = pFVar1 + 1;
        if (in_RSI <= in_stack_ffffffffffffffd8) goto LAB_002969eb;
        pFVar3 = in_stack_ffffffffffffffd8;
      } while ((((pFVar1[1].is_flash != 0) ||
                (pFVar3 = in_stack_ffffffffffffffd8, pFVar1->is_flash != 0)) ||
               (pFVar3 = in_stack_ffffffffffffffd8, pFVar1[-1].is_flash != 0)) ||
              (pFVar3 = in_stack_ffffffffffffffd8,
              pFVar1[1].noise_var <= 1.0 && pFVar1[1].noise_var != 1.0));
      bVar2 = true;
      local_20->noise_var = pFVar1[1].noise_var;
LAB_002969eb:
      pFVar3 = local_20;
      if (!bVar2) {
        do {
          pFVar1 = pFVar3;
          in_stack_ffffffffffffffd8 = pFVar1 + -1;
          if (in_stack_ffffffffffffffd8 < (FIRSTPASS_STATS *)(in_RDI + 0x1d0)) goto LAB_00296a95;
          pFVar3 = in_stack_ffffffffffffffd8;
        } while (((pFVar1[-1].is_flash != 0) ||
                 (pFVar3 = in_stack_ffffffffffffffd8, pFVar1[-2].is_flash != 0)) ||
                ((pFVar3 = in_stack_ffffffffffffffd8, pFVar1[-3].is_flash != 0 ||
                 (pFVar3 = in_stack_ffffffffffffffd8,
                 pFVar1[-1].noise_var <= 1.0 && pFVar1[-1].noise_var != 1.0))));
        local_20->noise_var = pFVar1[-1].noise_var;
      }
    }
LAB_00296a95:
  }
  local_20 = (FIRSTPASS_STATS *)(in_RDI + 0x1d0);
  do {
    pFVar3 = (FIRSTPASS_STATS *)in_RDI;
    if (in_RSI <= local_20) {
      while (local_20 = pFVar3,
            local_20 < in_RDI + 0x1d0 && (FIRSTPASS_STATS *)(in_RDI + 0x1d0) < in_RSI) {
        *(undefined8 *)((long)local_20 + 200) = *(undefined8 *)(in_RDI + 0x298);
        pFVar3 = (FIRSTPASS_STATS *)((long)local_20 + 0xe8);
      }
      iVar4 = smooth_filter_noise(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      if (iVar4 == -1) {
        aom_internal_error(in_RDX,AOM_CODEC_MEM_ERROR,
                           "Error allocating buffers in smooth_filter_noise()");
      }
      return;
    }
    if (((local_20->is_flash != 0) || (local_20[-1].is_flash != 0)) || (local_20[-2].is_flash != 0))
    {
      bVar2 = false;
      pFVar3 = local_20;
      do {
        pFVar1 = pFVar3;
        in_stack_ffffffffffffffd8 = pFVar1 + 1;
        if (in_RSI <= in_stack_ffffffffffffffd8) goto LAB_00296b7e;
        pFVar3 = in_stack_ffffffffffffffd8;
      } while (((pFVar1[1].is_flash != 0) ||
               (pFVar3 = in_stack_ffffffffffffffd8, pFVar1->is_flash != 0)) ||
              (pFVar3 = in_stack_ffffffffffffffd8, pFVar1[-1].is_flash != 0));
      bVar2 = true;
      local_20->noise_var = pFVar1[1].noise_var;
LAB_00296b7e:
      pFVar3 = local_20;
      if (!bVar2) {
        do {
          pFVar1 = pFVar3;
          in_stack_ffffffffffffffd8 = pFVar1 + -1;
          if (in_stack_ffffffffffffffd8 < (FIRSTPASS_STATS *)(in_RDI + 0x1d0)) goto LAB_00296c0e;
          pFVar3 = in_stack_ffffffffffffffd8;
        } while (((pFVar1[-1].is_flash != 0) ||
                 (pFVar3 = in_stack_ffffffffffffffd8, pFVar1[-2].is_flash != 0)) ||
                (pFVar3 = in_stack_ffffffffffffffd8, pFVar1[-3].is_flash != 0));
        local_20->noise_var = pFVar1[-1].noise_var;
      }
    }
LAB_00296c0e:
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static void estimate_noise(FIRSTPASS_STATS *first_stats,
                           FIRSTPASS_STATS *last_stats,
                           struct aom_internal_error_info *error_info) {
  FIRSTPASS_STATS *this_stats, *next_stats;
  double C1, C2, C3, noise;
  for (this_stats = first_stats + 2; this_stats < last_stats; this_stats++) {
    this_stats->noise_var = 0.0;
    // flashes tend to have high correlation of innovations, so ignore them.
    if (this_stats->is_flash || (this_stats - 1)->is_flash ||
        (this_stats - 2)->is_flash)
      continue;

    C1 = (this_stats - 1)->intra_error *
         (this_stats->intra_error - this_stats->coded_error);
    C2 = (this_stats - 2)->intra_error *
         ((this_stats - 1)->intra_error - (this_stats - 1)->coded_error);
    C3 = (this_stats - 2)->intra_error *
         (this_stats->intra_error - this_stats->sr_coded_error);
    if (C1 <= 0 || C2 <= 0 || C3 <= 0) continue;
    C1 = sqrt(C1);
    C2 = sqrt(C2);
    C3 = sqrt(C3);

    noise = (this_stats - 1)->intra_error - C1 * C2 / C3;
    noise = AOMMAX(noise, 0.01);
    this_stats->noise_var = noise;
  }

  // Copy noise from the neighbor if the noise value is not trustworthy
  for (this_stats = first_stats + 2; this_stats < last_stats; this_stats++) {
    if (this_stats->is_flash || (this_stats - 1)->is_flash ||
        (this_stats - 2)->is_flash)
      continue;
    if (this_stats->noise_var < 1.0) {
      int found = 0;
      // TODO(bohanli): consider expanding to two directions at the same time
      for (next_stats = this_stats + 1; next_stats < last_stats; next_stats++) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash || next_stats->noise_var < 1.0)
          continue;
        found = 1;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
      if (found) continue;
      for (next_stats = this_stats - 1; next_stats >= first_stats + 2;
           next_stats--) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash || next_stats->noise_var < 1.0)
          continue;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
    }
  }

  // copy the noise if this is a flash
  for (this_stats = first_stats + 2; this_stats < last_stats; this_stats++) {
    if (this_stats->is_flash || (this_stats - 1)->is_flash ||
        (this_stats - 2)->is_flash) {
      int found = 0;
      for (next_stats = this_stats + 1; next_stats < last_stats; next_stats++) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash)
          continue;
        found = 1;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
      if (found) continue;
      for (next_stats = this_stats - 1; next_stats >= first_stats + 2;
           next_stats--) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash)
          continue;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
    }
  }

  // if we are at the first 2 frames, copy the noise
  for (this_stats = first_stats;
       this_stats < first_stats + 2 && (first_stats + 2) < last_stats;
       this_stats++) {
    this_stats->noise_var = (first_stats + 2)->noise_var;
  }

  if (smooth_filter_noise(first_stats, last_stats) == -1) {
    aom_internal_error(error_info, AOM_CODEC_MEM_ERROR,
                       "Error allocating buffers in smooth_filter_noise()");
  }
}